

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Promise<void> __thiscall
kj::anon_unknown_31::NetworkAddressHttpClient::applyTimeouts(NetworkAddressHttpClient *this)

{
  Disposer *pDVar1;
  _func_int *p_Var2;
  _func_int *p_Var3;
  PromiseNode *pPVar4;
  TransformPromiseNodeBase *this_00;
  ImmediatePromiseNode<kj::_::Void> *pIVar5;
  ImmediatePromiseNode<kj::_::Void> *extraout_RDX;
  ImmediatePromiseNode<kj::_::Void> *extraout_RDX_00;
  _func_int **in_RSI;
  Own<kj::_::ChainPromiseNode> OVar6;
  Own<kj::_::ImmediatePromiseNode<kj::_::Void>_> OVar7;
  Promise<void> PVar8;
  Own<kj::_::PromiseNode> local_50;
  Own<kj::_::PromiseNode> local_40;
  undefined4 local_30;
  undefined4 uStack_2c;
  undefined8 uStack_28;
  
  if (in_RSI[0x12] == in_RSI[0xe]) {
    *(undefined1 *)((long)in_RSI + 0x4c) = 0;
    if ((*(int *)(in_RSI + 9) == 0) && (in_RSI[8] != (_func_int *)0x0)) {
      (*(code *)**(undefined8 **)in_RSI[8])(in_RSI[8],&local_30);
      p_Var2 = in_RSI[7];
      p_Var3 = in_RSI[8];
      in_RSI[7] = (_func_int *)0x0;
      in_RSI[8] = (_func_int *)0x0;
      if (p_Var3 != (_func_int *)0x0) {
        (*(code *)**(undefined8 **)p_Var2)(p_Var2,p_Var3 + *(long *)(*(long *)p_Var3 + -0x10));
      }
    }
    OVar7 = heap<kj::_::ImmediatePromiseNode<kj::_::Void>,kj::_::Void>((Void *)&local_30);
    pIVar5 = OVar7.ptr;
    (this->super_HttpClient)._vptr_HttpClient = (_func_int **)CONCAT44(uStack_2c,local_30);
    this->timer = uStack_28;
  }
  else {
    pDVar1 = *(Disposer **)(in_RSI[0xe] + 0x10);
    (**(code **)(*(long *)in_RSI[1] + 8))(&local_50,in_RSI[1],pDVar1);
    this_00 = (TransformPromiseNodeBase *)operator_new(0x38);
    _::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&local_50,
               _::
               TransformPromiseNode<kj::Promise<void>,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:3719:38),_kj::_::PropagateException>
               ::anon_class_16_2_3fe63c88_for_func::operator());
    (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_004619e0;
    this_00[1].super_PromiseNode._vptr_PromiseNode = in_RSI;
    this_00[1].dependency.disposer = pDVar1;
    local_40.disposer =
         (Disposer *)
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<void>,kj::_::Void,kj::(anonymous_namespace)::NetworkAddressHttpClient::applyTimeouts()::{lambda()#1},kj::_::PropagateException>>
          ::instance;
    local_40.ptr = (PromiseNode *)this_00;
    OVar6 = heap<kj::_::ChainPromiseNode,kj::Own<kj::_::PromiseNode>>((kj *)&local_30,&local_40);
    pPVar4 = local_40.ptr;
    pIVar5 = (ImmediatePromiseNode<kj::_::Void> *)OVar6.ptr;
    *(undefined4 *)&(this->super_HttpClient)._vptr_HttpClient = local_30;
    *(undefined4 *)((long)&(this->super_HttpClient)._vptr_HttpClient + 4) = uStack_2c;
    *(undefined4 *)&this->timer = (undefined4)uStack_28;
    *(undefined4 *)((long)&this->timer + 4) = uStack_28._4_4_;
    if ((TransformPromiseNodeBase *)local_40.ptr != (TransformPromiseNodeBase *)0x0) {
      local_40.ptr = (PromiseNode *)0x0;
      (**(local_40.disposer)->_vptr_Disposer)
                (local_40.disposer,
                 ((PromiseNode *)&pPVar4->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
                 (long)&((PromiseNode *)&pPVar4->_vptr_PromiseNode)->_vptr_PromiseNode);
      pIVar5 = extraout_RDX;
    }
    pPVar4 = local_50.ptr;
    if (local_50.ptr != (PromiseNode *)0x0) {
      local_50.ptr = (PromiseNode *)0x0;
      (**(local_50.disposer)->_vptr_Disposer)
                (local_50.disposer,pPVar4->_vptr_PromiseNode[-2] + (long)&pPVar4->_vptr_PromiseNode)
      ;
      pIVar5 = extraout_RDX_00;
    }
  }
  PVar8.super_PromiseBase.node.ptr = (PromiseNode *)pIVar5;
  PVar8.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar8.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> applyTimeouts() {
    if (availableClients.empty()) {
      timeoutsScheduled = false;
      if (activeConnectionCount == 0) {
        KJ_IF_MAYBE(f, drainedFulfiller) {
          f->get()->fulfill();
          drainedFulfiller = nullptr;
        }
      }
      return kj::READY_NOW;
    } else {
      auto time = availableClients.front().expires;
      return timer.atTime(time).then([this,time]() {
        while (!availableClients.empty() && availableClients.front().expires <= time) {
          availableClients.pop_front();
        }
        return applyTimeouts();
      });
    }
  }